

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

double __thiscall
BayesianGameForDecPOMDPStage::ComputeImmediateReward
          (BayesianGameForDecPOMDPStage *this,Index jtI,Index jaI)

{
  value_type pJVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  char cVar3;
  undefined4 uVar4;
  const_reference ppJVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  BeliefIteratorGeneric bit;
  undefined **local_38;
  long *local_30;
  ulong local_28;
  ulong local_20;
  
  ppJVar5 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                      (&this->_m_JBs,(ulong)jtI);
  pJVar1 = *ppJVar5;
  if (pJVar1 == (value_type)0x0) {
    dVar6 = 0.0;
  }
  else {
    (**(code **)(*(long *)((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8)) + 0x98))
              (&local_38,(long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8));
    auVar7 = ZEXT816(0);
    do {
      auVar8._0_8_ = auVar7._0_8_;
      uVar4 = (**(code **)(*local_30 + 0x18))();
      local_20 = (**(code **)(*local_30 + 0x10))();
      pDVar2 = this->_m_pu->_m_DecPOMDP;
      local_28 = (**(code **)(*(long *)pDVar2 + 0xc0))(pDVar2,uVar4,jaI);
      cVar3 = (**(code **)(*local_30 + 0x20))();
      auVar8._8_8_ = 0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_28;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_20;
      auVar7 = vfmadd231sd_fma(auVar8,auVar9,auVar7);
      dVar6 = auVar7._0_8_;
    } while (cVar3 != '\0');
    local_38 = &PTR__BeliefIteratorGeneric_005d3870;
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
  }
  return dVar6;
}

Assistant:

double BayesianGameForDecPOMDPStage::
ComputeImmediateReward(Index jtI, Index jaI) const
{
    //Index jaohI = _m_jaohReps.at(jtI);
    JointBeliefInterface* jb = _m_JBs.at(jtI);
    double r = 0.0;
    if(jb)
    {    
        BeliefIteratorGeneric bit = jb->GetIterator();
        do{
            Index s = bit.GetStateIndex();
            double p = bit.GetProbability();
            r += p * _m_pu->GetReward(s, jaI);
        }while (bit.Next() );
    }
    return r;
    
}